

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O2

void __thiscall SCCTest_Singleton_Test::TestBody(SCCTest_Singleton_Test *this)

{
  AssertionResult *this_00;
  char *pcVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_00;
  undefined1 local_180 [8];
  GraphSCCs sccs;
  SCC scc;
  Graph_conflict1 graph;
  undefined1 local_d0 [8];
  Iterator sccIt;
  AssertionResult gtest_ar_6;
  SCC local_80;
  Iterator it;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  less<unsigned_int> local_14;
  allocator_type local_13;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_12;
  allocator_type local_11;
  
  Graph::Graph((Graph *)&scc,1);
  GraphSCCs::GraphSCCs((GraphSCCs *)local_180,(Graph_conflict1 *)&scc);
  local_80.parent =
       (SCCs<IntIt,_GraphSCCs> *)
       ::wasm::SCCs<IntIt,_GraphSCCs>::begin((SCCs<IntIt,_GraphSCCs> *)local_180);
  it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
  testing::internal::
  CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
            ((internal *)local_48,"it","sccs.end()",(Iterator *)&local_80,&it);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&it);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x66,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    sccs.graph = (Graph_conflict1 *)local_80.parent;
    _local_d0 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::begin((SCC *)&sccs.graph);
    it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
    testing::internal::
    CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator,wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator>
              ((internal *)local_48,"sccIt","scc.end()",(Iterator *)local_d0,(Iterator *)&it);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x6a,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      it.scc.parent._0_4_ = sccIt.parent._0_4_;
      gtest_ar_6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_48,"*sccIt","0u",(uint *)&it,(uint *)&gtest_ar_6.message_);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&it);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                   ,0x6b,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
          (**(code **)(*(long *)it.scc.parent + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::operator++((Iterator *)local_d0);
      it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
      testing::internal::
      CmpHelperEQ<wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator,wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator>
                ((internal *)local_48,"sccIt","scc.end()",(Iterator *)local_d0,(Iterator *)&it);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&it);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                   ,0x6e,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
          (**(code **)(*(long *)it.scc.parent + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
      testing::internal::
      CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
                ((internal *)local_48,"it","sccs.end()",(Iterator *)&local_80,&it);
      if (local_48[0] != (internal)0x0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
        ::wasm::SCCs<IntIt,_GraphSCCs>::Iterator::operator++((Iterator *)&local_80);
        it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
        testing::internal::
        CmpHelperEQ<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
                  ((internal *)local_48,"it","sccs.end()",(Iterator *)&local_80,&it);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)&it);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                     ,0x72,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
            (**(code **)(*(long *)it.scc.parent + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
        getSCCs((SCCSet *)local_48,(Graph_conflict1 *)&scc);
        graph.graph.
        super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        __l._M_len = 1;
        __l._M_array = (iterator)
                       ((long)&graph.graph.
                               super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &gtest_ar_6.message_,__l,&local_14,&local_13);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&gtest_ar_6.message_;
        std::
        set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ::set((set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               *)&it,__l_00,&local_12,&local_11);
        testing::internal::
        CmpHelperEQ<std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
                  ((internal *)&sccIt.val,"getSCCs(graph)","SCCSet{{0}}",
                   (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    *)local_48,
                   (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    *)&it);
        std::
        _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     *)&it);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&gtest_ar_6.message_);
        std::
        _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     *)local_48);
        if (sccIt.val.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ == '\0') {
          testing::Message::Message((Message *)local_48);
          if (gtest_ar_6._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar_6._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&it,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                     ,0x74,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)&it,(Message *)local_48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it);
          if ((long *)CONCAT71(local_48._1_7_,local_48[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_48._1_7_,local_48[0]) + 8))();
          }
        }
        this_00 = &gtest_ar_6;
        goto LAB_001c7eb3;
      }
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x6f,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
    }
  }
  this_00 = &gtest_ar;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
  if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
    (**(code **)(*(long *)it.scc.parent + 8))();
  }
LAB_001c7eb3:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  ::wasm::SCCs<IntIt,_GraphSCCs>::~SCCs((SCCs<IntIt,_GraphSCCs> *)local_180);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&scc);
  return;
}

Assistant:

TEST(SCCTest, Singleton) {
  Graph graph(1);
  GraphSCCs sccs(graph);

  auto it = sccs.begin();
  ASSERT_NE(it, sccs.end());

  auto scc = *it;
  auto sccIt = scc.begin();
  ASSERT_NE(sccIt, scc.end());
  EXPECT_EQ(*sccIt, 0u);

  ++sccIt;
  EXPECT_EQ(sccIt, scc.end());
  ASSERT_NE(it, sccs.end());

  ++it;
  EXPECT_EQ(it, sccs.end());

  EXPECT_EQ(getSCCs(graph), SCCSet{{0}});
}